

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrint<phmap::priv::(anonymous_namespace)::StringTable>
               (StringTable *value,ostream *os)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  anon_union_8_1_a8a14541_for_iterator_1 value_00;
  long lVar3;
  const_iterator __begin0;
  
  std::operator<<(os,'{');
  __begin0.inner_ =
       phmap::priv::
       raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
       ::begin(&value->
                super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              );
  pcVar1 = (value->
           super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
           ).ctrl_;
  sVar2 = (value->
          super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
          ).capacity_;
  lVar3 = 0;
  do {
    if (__begin0.inner_.ctrl_ == pcVar1 + sVar2) {
      if (lVar3 != 0) {
LAB_00126baf:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value_00 = __begin0.inner_.field_1;
    if ((lVar3 != 0) && (std::operator<<(os,','), lVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00126baf;
    }
    std::operator<<(os,' ');
    PrintTo<std::__cxx11::string,std::__cxx11::string>(&(value_00.slot_)->pair,os);
    lVar3 = lVar3 + 1;
    phmap::priv::
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::iterator::operator++(&__begin0.inner_);
  } while( true );
}

Assistant:

void UniversalPrint(const T& value, ::std::ostream* os) {
  // A workarond for the bug in VC++ 7.1 that prevents us from instantiating
  // UniversalPrinter with T directly.
  typedef T T1;
  UniversalPrinter<T1>::Print(value, os);
}